

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_integer_test.cc
# Opt level: O0

void __thiscall AomLeb128_EncodeFailTest_Test::TestBody(AomLeb128_EncodeFailTest_Test *this)

{
  bool bVar1;
  AssertHelper *this_00;
  AssertionResult gtest_ar_4;
  size_t kPadSizeOutOfRange;
  AssertionResult gtest_ar_3;
  uint64_t kValueOutOfRange;
  AssertionResult gtest_ar_2;
  uint32_t kValueOutOfRangeForBuffer;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  size_t coded_size;
  uint8_t write_buffer [4];
  uint32_t kValidTestValue;
  size_t kWriteBufferSize;
  AssertHelper *in_stack_fffffffffffffe70;
  int *in_stack_fffffffffffffe78;
  AssertionResult *this_01;
  undefined7 in_stack_fffffffffffffe80;
  undefined1 in_stack_fffffffffffffe87;
  undefined1 uVar2;
  uint8_t *in_stack_fffffffffffffe88;
  int line;
  char *in_stack_fffffffffffffe90;
  AssertionResult *this_02;
  undefined4 in_stack_fffffffffffffe98;
  Type in_stack_fffffffffffffe9c;
  Type type;
  AssertHelper *in_stack_fffffffffffffea0;
  Message *in_stack_fffffffffffffee8;
  AssertHelper *in_stack_fffffffffffffef0;
  AssertionResult local_100;
  undefined8 local_f0;
  undefined4 local_d8;
  int local_d4;
  AssertionResult local_d0;
  undefined8 local_c0;
  undefined4 local_a8;
  int local_a4;
  AssertionResult local_a0;
  undefined4 local_8c;
  undefined4 local_78;
  int local_74;
  AssertionResult local_70;
  uint local_5c;
  undefined4 local_38;
  int local_34;
  AssertionResult local_30;
  size_t local_20;
  uint8_t local_18 [24];
  
  local_18[8] = '\x04';
  local_18[9] = '\0';
  local_18[10] = '\0';
  local_18[0xb] = '\0';
  local_18[0xc] = '\0';
  local_18[0xd] = '\0';
  local_18[0xe] = '\0';
  local_18[0xf] = '\0';
  local_18[4] = '\x01';
  local_18[5] = '\0';
  local_18[6] = '\0';
  local_18[7] = '\0';
  local_18[0] = '\0';
  local_18[1] = '\0';
  local_18[2] = '\0';
  local_18[3] = '\0';
  local_20 = 0;
  local_34 = aom_uleb_encode(CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                             (size_t)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                             (size_t *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80)
                            );
  local_38 = 0xffffffff;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_fffffffffffffe88,
             (char *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
             in_stack_fffffffffffffe78,(int *)in_stack_fffffffffffffe70);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_30);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffea0);
    testing::AssertionResult::failure_message((AssertionResult *)0x3afbbe);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,in_stack_fffffffffffffe90,
               (int)((ulong)in_stack_fffffffffffffe88 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80));
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffe70);
    testing::Message::~Message((Message *)0x3afc1b);
  }
  local_5c = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3afc89);
  if (local_5c == 0) {
    local_74 = aom_uleb_encode(CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                               (size_t)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                               (size_t *)
                               CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80));
    local_78 = 0xffffffff;
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((char *)in_stack_fffffffffffffe88,
               (char *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
               in_stack_fffffffffffffe78,(int *)in_stack_fffffffffffffe70);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_70);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffea0);
      testing::AssertionResult::failure_message((AssertionResult *)0x3afd5e);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,in_stack_fffffffffffffe90,
                 (int)((ulong)in_stack_fffffffffffffe88 >> 0x20),
                 (char *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80));
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
      testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffe70);
      testing::Message::~Message((Message *)0x3afdbb);
    }
    local_5c = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3afe29);
    if (local_5c == 0) {
      local_8c = 0xffffffff;
      local_a4 = aom_uleb_encode(CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                                 (size_t)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                                 (size_t *)
                                 CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80));
      local_a8 = 0xffffffff;
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                ((char *)in_stack_fffffffffffffe88,
                 (char *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
                 in_stack_fffffffffffffe78,(int *)in_stack_fffffffffffffe70);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_a0);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffea0);
        in_stack_fffffffffffffea0 =
             (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x3aff0d);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,in_stack_fffffffffffffe90,
                   (int)((ulong)in_stack_fffffffffffffe88 >> 0x20),
                   (char *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80));
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
        testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffe70);
        testing::Message::~Message((Message *)0x3aff6a);
      }
      local_5c = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3affd8);
      if (local_5c == 0) {
        local_c0 = 0x100000000;
        local_d4 = aom_uleb_encode(CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                                   (size_t)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                                   (size_t *)
                                   CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80));
        local_d8 = 0xffffffff;
        this_02 = &local_d0;
        testing::internal::EqHelper::Compare<int,_int,_nullptr>
                  ((char *)in_stack_fffffffffffffe88,
                   (char *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
                   in_stack_fffffffffffffe78,(int *)in_stack_fffffffffffffe70);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(this_02);
        type = CONCAT13(bVar1,(int3)in_stack_fffffffffffffe9c);
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_fffffffffffffea0);
          in_stack_fffffffffffffe88 =
               (uint8_t *)testing::AssertionResult::failure_message((AssertionResult *)0x3b00be);
          testing::internal::AssertHelper::AssertHelper
                    (in_stack_fffffffffffffea0,type,&this_02->success_,
                     (int)((ulong)in_stack_fffffffffffffe88 >> 0x20),
                     (char *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80));
          testing::internal::AssertHelper::operator=
                    (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
          testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffe70);
          testing::Message::~Message((Message *)0x3b011b);
        }
        local_5c = (uint)!bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x3b0189);
        if (local_5c == 0) {
          local_f0 = 5;
          aom_uleb_encode_fixed_size(1,4,5,local_18,&local_20);
          this_01 = &local_100;
          testing::internal::EqHelper::Compare<int,_int,_nullptr>
                    ((char *)in_stack_fffffffffffffe88,
                     (char *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
                     (int *)this_01,(int *)in_stack_fffffffffffffe70);
          line = (int)((ulong)in_stack_fffffffffffffe88 >> 0x20);
          bVar1 = testing::AssertionResult::operator_cast_to_bool(this_01);
          if (!bVar1) {
            uVar2 = bVar1;
            testing::Message::Message((Message *)in_stack_fffffffffffffea0);
            this_00 = (AssertHelper *)
                      testing::AssertionResult::failure_message((AssertionResult *)0x3b0273);
            testing::internal::AssertHelper::AssertHelper
                      (in_stack_fffffffffffffea0,type,&this_02->success_,line,
                       (char *)CONCAT17(uVar2,in_stack_fffffffffffffe80));
            testing::internal::AssertHelper::operator=
                      (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
            testing::internal::AssertHelper::~AssertHelper(this_00);
            testing::Message::~Message((Message *)0x3b02d0);
          }
          local_5c = (uint)!bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x3b033b);
        }
      }
    }
  }
  return;
}

Assistant:

TEST(AomLeb128, EncodeFailTest) {
  const size_t kWriteBufferSize = 4;
  const uint32_t kValidTestValue = 1;
  uint8_t write_buffer[kWriteBufferSize] = { 0 };
  size_t coded_size = 0;
  ASSERT_EQ(
      aom_uleb_encode(kValidTestValue, kWriteBufferSize, nullptr, &coded_size),
      -1);
  ASSERT_EQ(aom_uleb_encode(kValidTestValue, kWriteBufferSize, &write_buffer[0],
                            nullptr),
            -1);

  const uint32_t kValueOutOfRangeForBuffer = 0xFFFFFFFF;
  ASSERT_EQ(aom_uleb_encode(kValueOutOfRangeForBuffer, kWriteBufferSize,
                            &write_buffer[0], &coded_size),
            -1);

  const uint64_t kValueOutOfRange = kMaximumLeb128Value + 1;
  ASSERT_EQ(aom_uleb_encode(kValueOutOfRange, kWriteBufferSize,
                            &write_buffer[0], &coded_size),
            -1);

  const size_t kPadSizeOutOfRange = 5;
  ASSERT_EQ(aom_uleb_encode_fixed_size(kValidTestValue, kWriteBufferSize,
                                       kPadSizeOutOfRange, &write_buffer[0],
                                       &coded_size),
            -1);
}